

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::anon_unknown_0::as_utf8_end(char *buffer,size_t size,wchar_t *str,size_t length)

{
  wchar_t ch;
  undefined1 auVar1 [16];
  value_type result;
  size_t sVar2;
  undefined1 auVar3 [16];
  
  result = (value_type)buffer;
  if (length != 0) {
    sVar2 = 0;
    do {
      ch = str[sVar2];
      if ((uint)ch < 0x10000) {
        result = utf8_writer::low(result,ch);
      }
      else {
        auVar3 = vpinsrb_avx(ZEXT416((uint)ch >> 0x12),(uint)ch >> 0xc & 0xfff3f,1);
        auVar3 = vpinsrb_avx(auVar3,(uint)ch >> 6 & 0x3ffff3f,2);
        auVar3 = vpinsrb_avx(auVar3,ch & 0xffffff3f,3);
        auVar1._8_4_ = 0x808080f0;
        auVar1._0_8_ = 0x808080f0808080f0;
        auVar1._12_4_ = 0x808080f0;
        auVar3 = vpord_avx512vl(auVar3,auVar1);
        *(int *)result = auVar3._0_4_;
        result = result + 4;
      }
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
  }
  if ((value_type)(buffer + size) == result) {
    return;
  }
  __assert_fail("begin + size == end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                ,0x8f4,
                "void pugi::impl::(anonymous namespace)::as_utf8_end(char *, size_t, const wchar_t *, size_t)"
               );
}

Assistant:

PUGI__FN void as_utf8_end(char* buffer, size_t size, const wchar_t* str, size_t length)
	{
		// convert to utf8
		uint8_t* begin = reinterpret_cast<uint8_t*>(buffer);
		uint8_t* end = wchar_decoder::process(str, length, begin, utf8_writer());

		assert(begin + size == end);
		(void)!end;
		(void)!size;
	}